

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

void __thiscall Json::Value::removeMember(Value *this,char *key)

{
  size_t sVar1;
  key_type *in_RSI;
  string *in_RDI;
  CZString actualKey;
  ostringstream oss;
  CZString *this_00;
  CZString local_1c8 [4];
  ostringstream local_188 [392];
  
  if (((in_RDI->_M_string_length & 0xff) != 0) && ((in_RDI->_M_string_length & 0xff) != 7)) {
    std::__cxx11::ostringstream::ostringstream(local_188);
    std::operator<<((ostream *)local_188,"in Json::Value::removeMember(): requires objectValue");
    std::__cxx11::ostringstream::str();
    throwLogicError(in_RDI);
  }
  if ((in_RDI->_M_string_length & 0xff) != 0) {
    sVar1 = strlen((char *)in_RSI);
    this_00 = local_1c8;
    CZString::CZString(this_00,(char *)in_RSI,(uint)sVar1,noDuplication);
    std::
    map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
    ::erase((map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
             *)this_00,in_RSI);
    CZString::~CZString(this_00);
  }
  return;
}

Assistant:

void Value::removeMember(const char* key)
{
  JSON_ASSERT_MESSAGE(type_ == nullValue || type_ == objectValue,
                      "in Json::Value::removeMember(): requires objectValue");
  if (type_ == nullValue)
    return;

  CZString actualKey(key, unsigned(strlen(key)), CZString::noDuplication);
  value_.map_->erase(actualKey);
}